

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value.c
# Opt level: O1

value value_copy(value v)

{
  undefined8 *puVar1;
  void *pvVar2;
  undefined8 *__dest;
  size_t __n;
  
  if (v == (value)0x28 || v == (value)0x0) {
    __n = 0;
  }
  else {
    __n = *(size_t *)((long)v + -0x20);
  }
  puVar1 = (undefined8 *)malloc(__n + 0x28);
  if (puVar1 == (undefined8 *)0x0) {
    __dest = (undefined8 *)0x0;
  }
  else {
    *puVar1 = "value_impl_magic_alloc";
    puVar1[1] = __n;
    puVar1[2] = 1;
    __dest = puVar1 + 5;
    puVar1[3] = 0;
    puVar1[4] = 0;
  }
  if (__dest != (undefined8 *)0x0) {
    pvVar2 = memcpy(__dest,v,__n);
    return pvVar2;
  }
  return (value)0x0;
}

Assistant:

value value_copy(value v)
{
	size_t size = value_size(v);

	value copy = value_alloc(size);

	if (copy == NULL)
	{
		return NULL;
	}

	memcpy(copy, value_data(v), size);

	return copy;
}